

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O2

void printImmScale(MCInst *MI,uint OpNum,SStream *O,int Scale)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  MCOperand *op;
  int64_t iVar3;
  int iVar4;
  
  op = MCInst_getOperand(MI,OpNum);
  iVar3 = MCOperand_getImm(op);
  printInt64Bang(O,iVar3 * (ulong)(uint)Scale);
  if (MI->csh->detail != CS_OPT_OFF) {
    iVar4 = (int)(iVar3 * (ulong)(uint)Scale);
    if (MI->csh->doing_mem == true) {
      pcVar2 = MI->flat_insn->detail;
      *(int *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x3e) = iVar4;
    }
    else {
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x2e;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      pcVar2 = MI->flat_insn->detail;
      *(long *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x30 + 0x36) = (long)iVar4
      ;
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar1 = *puVar1 + '\x01';
    }
  }
  return;
}

Assistant:

static void printImmScale(MCInst *MI, unsigned OpNum, SStream *O, int Scale)
{
	int64_t val = Scale * MCOperand_getImm(MCInst_getOperand(MI, OpNum));

	printInt64Bang(O, val);

	if (MI->csh->detail) {
		if (MI->csh->doing_mem) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].mem.disp = (int)val;
		} else {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = (int)val;
			MI->flat_insn->detail->arm64.op_count++;
		}
	}
}